

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.cpp
# Opt level: O2

void __thiscall groundupdbext::DefaultQueryResult::DefaultQueryResult(DefaultQueryResult *this)

{
  (this->super_IQueryResult)._vptr_IQueryResult = (_func_int **)&PTR__DefaultQueryResult_00138aa8;
  std::
  make_unique<std::unordered_set<groundupdb::HashedValue,std::hash<groundupdb::HashedValue>,std::equal_to<groundupdb::HashedValue>,std::allocator<groundupdb::HashedValue>>>
            ();
  return;
}

Assistant:

DefaultQueryResult::DefaultQueryResult()
  : m_recordKeys(std::make_unique<std::unordered_set<HashedKey>>())
{
  ;
}